

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_choice(lyout *out,int level,lys_node *node)

{
  long lVar1;
  lys_node_choice *choice;
  lys_node *sub;
  int content;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._0_4_ = 0;
  _content = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,"choice","name",node->name,0);
  node_local._4_4_ = node_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&sub,1);
  lVar1._0_1_ = node->hash[0];
  lVar1._1_1_ = node->hash[1];
  lVar1._2_1_ = node->hash[2];
  lVar1._3_1_ = node->hash[3];
  lVar1._4_4_ = *(undefined4 *)&node->field_0x6c;
  if (lVar1 != 0) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_when(plStack_10,node_local._4_4_,_content->module,*(lys_when **)node->hash);
  }
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->iffeature_size; sub._4_4_ = sub._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_iffeature(plStack_10,node_local._4_4_,_content->module,node->iffeature + sub._4_4_);
  }
  if (node[1].name != (char *)0x0) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_substmt(plStack_10,node_local._4_4_,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)node[1].name,
                      _content->module,_content->ext,(uint)_content->ext_size);
  }
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&sub,0x7c);
  for (choice = (lys_node_choice *)_content->child; choice != (lys_node_choice *)0x0;
      choice = (lys_node_choice *)choice->next) {
    if (choice->parent == _content) {
      yin_print_close_parent(plStack_10,(int *)&sub);
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)choice,0x807f);
    }
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,"choice",(int)sub);
  return;
}

Assistant:

static void
yin_print_choice(struct lyout *out, int level, const struct lys_node *node)
{
    int i, content = 0;
    struct lys_node *sub;
    struct lys_node_choice *choice = (struct lys_node_choice *)node;

    yin_print_open(out, level, NULL, "choice", "name", node->name, content);
    level++;

    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT);
    if (choice->when) {
        yin_print_close_parent(out, &content);
        yin_print_when(out, level, node->module, choice->when);
    }
    for (i = 0; i < choice->iffeature_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_iffeature(out, level, node->module, &choice->iffeature[i]);
    }
    if (choice->dflt) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, 0, choice->dflt->name,
                          node->module, node->ext, node->ext_size);
    }

    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_CONFIG | SNODE_COMMON_MAND |
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub,
                        LYS_CHOICE |LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_CASE);
    }

    level--;
    yin_print_close(out, level, NULL, "choice", content);
}